

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void Utils::print_vec_unicode_from_to
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int from,int to)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  
  bVar4 = 0;
  for (lVar5 = (long)from; lVar5 < to; lVar5 = lVar5 + 1) {
    uVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    uVar3 = 0;
    bVar2 = 0;
    if (((bool)(lVar5 < 1 | bVar4 | uVar1 != 0)) && (uVar3 = uVar1, bVar2 = bVar4, uVar1 == 0)) {
      bVar4 = 1;
    }
    else {
      std::operator<<((ostream *)&std::cout,(char)uVar3);
      bVar4 = bVar2;
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Utils::print_vec_unicode_from_to(std::vector<unsigned int>& vec, int from, int to) {
    bool lastCharIsBlank = false;
    for(int i=from; i < to; ++i){
        if(i > 0 && vec[i] == 0 && !lastCharIsBlank) {
            std::cout << (char)vec[i];
            continue;
        }
        if (vec[i] == 0) {
            lastCharIsBlank = true;
            continue;
        }
        std::cout << (char)vec[i];
    }
    std::cout << endl;
}